

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

GLvoid __thiscall glcts::anon_unknown_0::GatherBase::CreateTextureSRGB(GatherBase *this)

{
  CallLogWrapper *this_00;
  int internalformat;
  GLenum format;
  void *__s;
  int i;
  int level;
  ulong uVar1;
  GLubyte data [16];
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  format = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->tex);
  uVar1 = 0x20;
  level = 0;
  do {
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,level,internalformat,(GLsizei)uVar1,(GLsizei)uVar1,0,format,0x1401,
               (void *)0x0);
    level = level + 1;
    uVar1 = uVar1 >> 1;
  } while (level != 6);
  __s = operator_new(0x1000);
  memset(__s,0xff,0x1000);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0,0,0x20,0x20,format,0x1401,__s);
  if (format != 0x1902) {
    glu::CallLogWrapper::glGenerateMipmap(this_00,0xde1);
  }
  data[0] = 0xf0;
  data[1] = '\r';
  data[2] = '\x0e';
  data[3] = '\x0f';
  data[4] = 0xa0;
  data[5] = '\t';
  data[6] = '\n';
  data[7] = '\v';
  data[8] = '\0';
  data[9] = '\x01';
  data[10] = '\x02';
  data[0xb] = '\x03';
  data[0xc] = 'P';
  data[0xd] = '\x05';
  data[0xe] = '\x06';
  data[0xf] = '\a';
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0x16,0x19,2,2,format,0x1401,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0x10,10,1,1,format,0x1401,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0xb,2,1,1,format,0x1401,data + 4);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0x18,0xd,1,1,format,0x1401,data + 8);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,9,0xe,1,1,format,0x1401,data + 0xc);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x8072,0x812f);
  operator_delete(__s,0x1000);
  return;
}

Assistant:

virtual GLvoid CreateTextureSRGB()
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= 32;
		GLint		size			= csize;
		GLenum		target			= GL_TEXTURE_2D;
		GLenum		tex_type		= GL_UNSIGNED_BYTE;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage2D(target, i, internal_format, size, size, 0, format, tex_type, 0);
		}
		std::vector<GLubyte> pixels(csize * csize * 4, 255);
		glTexSubImage2D(target, 0, 0, 0, csize, csize, format, tex_type, &pixels[0]);

		if (format != GL_DEPTH_COMPONENT)
		{
			glGenerateMipmap(target);
		}

		GLubyte data[16] = { 240, 13, 14, 15, 160, 9, 10, 11, 0, 1, 2, 3, 80, 5, 6, 7 };

		glTexSubImage2D(target, 0, 22, 25, 2, 2, format, tex_type, data);
		glTexSubImage2D(target, 0, 16, 10, 1, 1, format, tex_type, data + 0);
		glTexSubImage2D(target, 0, 11, 2, 1, 1, format, tex_type, data + 4);
		glTexSubImage2D(target, 0, 24, 13, 1, 1, format, tex_type, data + 8);
		glTexSubImage2D(target, 0, 9, 14, 1, 1, format, tex_type, data + 12);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	}